

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::SourceCodeInfo_Location::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  Nullable<const_char_*> failure_msg;
  Arena *pAVar4;
  SourceCodeInfo_Location *_this;
  SourceCodeInfo_Location *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (SourceCodeInfo_Location *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::SourceCodeInfo_Location_const*,google::protobuf::SourceCodeInfo_Location*>
                          ((SourceCodeInfo_Location **)local_20,&local_28,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    RepeatedField<int>::MergeFrom
              (&(local_28->field_0)._impl_.path_,
               (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
    RepeatedField<int>::MergeFrom
              (&(local_28->field_0)._impl_.span_,(RepeatedField<int> *)(from_msg + 3));
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(&(local_28->field_0)._impl_.leading_detached_comments_,
                (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&from_msg[4]._internal_metadata_);
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        pp_Var2 = from_msg[6]._vptr_MessageLite;
        (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(local_28->field_0)._impl_.leading_comments_,
                   (string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4);
      }
      if ((uVar1 & 2) != 0) {
        uVar3 = from_msg[6]._internal_metadata_.ptr_;
        (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 2;
        pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(local_28->field_0)._impl_.trailing_comments_,
                   (string *)(uVar3 & 0xfffffffffffffffc),pAVar4);
      }
    }
    (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_28->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x39b7,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

void SourceCodeInfo_Location::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<SourceCodeInfo_Location*>(&to_msg);
  auto& from = static_cast<const SourceCodeInfo_Location&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_path()->MergeFrom(from._internal_path());
  _this->_internal_mutable_span()->MergeFrom(from._internal_span());
  _this->_internal_mutable_leading_detached_comments()->MergeFrom(from._internal_leading_detached_comments());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_leading_comments(from._internal_leading_comments());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}